

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall ON_CheckSum::IsSet(ON_CheckSum *this)

{
  bool local_11;
  ON_CheckSum *this_local;
  
  local_11 = true;
  if ((((((this->m_size == 0) && (local_11 = true, this->m_time == 0)) &&
        (local_11 = true, this->m_crc[0] == 0)) &&
       ((local_11 = true, this->m_crc[1] == 0 && (local_11 = true, this->m_crc[2] == 0)))) &&
      ((local_11 = true, this->m_crc[3] == 0 &&
       ((local_11 = true, this->m_crc[4] == 0 && (local_11 = true, this->m_crc[5] == 0)))))) &&
     (local_11 = true, this->m_crc[6] == 0)) {
    local_11 = this->m_crc[7] != 0;
  }
  return local_11;
}

Assistant:

bool ON_CheckSum::IsSet() const
{
  return ( 0 != m_size 
           || 0 != m_time 
           || 0 != m_crc[0]
           || 0 != m_crc[1]
           || 0 != m_crc[2]
           || 0 != m_crc[3]
           || 0 != m_crc[4]
           || 0 != m_crc[5]
           || 0 != m_crc[6]
           || 0 != m_crc[7]
           );           
}